

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::ConfidentialTransactionContext::Verify(ConfidentialTransactionContext *this,OutPoint *outpoint)

{
  bool bVar1;
  uint uVar2;
  CfdException *this_00;
  ConfidentialTransactionContext *this_01;
  allocator local_551;
  undefined1 local_550 [32];
  string local_530;
  UtxoData utxo;
  
  UtxoData::UtxoData(&utxo);
  bVar1 = IsFindUtxoMap(this,outpoint,&utxo);
  if (bVar1) {
    uVar2 = (*(this->super_ConfidentialTransaction).super_AbstractTransaction.
              _vptr_AbstractTransaction[0xf])(this,outpoint);
    local_550._8_8_ = 0;
    local_550._0_8_ = CreateConfidentialTxSighash;
    local_550._24_8_ =
         std::
         _Function_handler<cfd::core::ByteData256_(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*),_cfd::core::ByteData256_(*)(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
         ::_M_invoke;
    local_550._16_8_ =
         std::
         _Function_handler<cfd::core::ByteData256_(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*),_cfd::core::ByteData256_(*)(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
         ::_M_manager;
    TransactionContextUtil::Verify<cfd::ConfidentialTransactionContext>
              (this,outpoint,&utxo,
               &(this->super_ConfidentialTransaction).vin_.
                super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar2].super_AbstractTxIn,
               (function<cfd::core::ByteData256_(const_cfd::ConfidentialTransactionContext_*,_const_cfd::core::OutPoint_&,_const_cfd::UtxoData_&,_const_cfd::core::SigHashType_&,_const_cfd::core::Pubkey_&,_const_cfd::core::Script_&,_cfd::core::WitnessVersion,_const_cfd::core::ByteData_*,_const_cfd::core::TaprootScriptTree_*)>
                *)local_550);
    this_01 = (ConfidentialTransactionContext *)local_550;
    std::_Function_base::~_Function_base((_Function_base *)this_01);
    bVar1 = IsFindOutPoint(this_01,&this->verify_map_,outpoint);
    if (!bVar1) {
      std::vector<cfd::core::OutPoint,std::allocator<cfd::core::OutPoint>>::
      emplace_back<cfd::core::OutPoint_const&>
                ((vector<cfd::core::OutPoint,std::allocator<cfd::core::OutPoint>> *)
                 &this->verify_map_,outpoint);
    }
    UtxoData::~UtxoData(&utxo);
    return;
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)(local_550 + 0x20),"Utxo is not found. verify fail.",&local_551);
  core::CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)(local_550 + 0x20));
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void ConfidentialTransactionContext::Verify(const OutPoint& outpoint) {
  UtxoData utxo;
  if (!IsFindUtxoMap(outpoint, &utxo)) {
    throw CfdException(
        CfdError::kCfdIllegalStateError, "Utxo is not found. verify fail.");
  }
  const auto& txin = vin_[GetTxInIndex(outpoint)];

  TransactionContextUtil::Verify<ConfidentialTransactionContext>(
      this, outpoint, utxo, &txin, CreateConfidentialTxSighash);
  if (!IsFindOutPoint(verify_map_, outpoint)) {
    verify_map_.emplace_back(outpoint);
  }
}